

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

char * cs_md5(char *buf,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  size_t *local_188;
  undefined8 *local_170;
  size_t local_158 [4];
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  size_t local_a8;
  size_t len;
  MD5_CTX ctx;
  va_list ap;
  uchar *p;
  uchar hash [16];
  char *buf_local;
  
  if (in_AL != '\0') {
    local_128 = in_XMM0_Qa;
    local_118 = in_XMM1_Qa;
    local_108 = in_XMM2_Qa;
    local_f8 = in_XMM3_Qa;
    local_e8 = in_XMM4_Qa;
    local_d8 = in_XMM5_Qa;
    local_c8 = in_XMM6_Qa;
    local_b8 = in_XMM7_Qa;
  }
  local_158[1] = in_RSI;
  local_158[2] = in_RDX;
  local_158[3] = in_RCX;
  local_138 = in_R8;
  local_130 = in_R9;
  MD5_Init((MD5_CTX *)&len);
  ap[0]._0_8_ = &stack0x00000008;
  ctx.in[0x3c] = '0';
  ctx.in[0x3d] = '\0';
  ctx.in[0x3e] = '\0';
  ctx.in[0x3f] = '\0';
  ctx.in[0x38] = '\b';
  ctx.in[0x39] = '\0';
  ctx.in[0x3a] = '\0';
  ctx.in[0x3b] = '\0';
  while( true ) {
    if ((uint)ctx.in._56_4_ < 0x29) {
      local_170 = (undefined8 *)((long)local_158 + (long)(int)ctx.in._56_4_);
      ctx.in._56_4_ = ctx.in._56_4_ + 8;
    }
    else {
      local_170 = (undefined8 *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    if ((void *)*local_170 == (void *)0x0) break;
    if ((uint)ctx.in._56_4_ < 0x29) {
      local_188 = (size_t *)((long)local_158 + (long)(int)ctx.in._56_4_);
      ctx.in._56_4_ = ctx.in._56_4_ + 8;
    }
    else {
      local_188 = (size_t *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    local_a8 = *local_188;
    MD5_Update((MD5_CTX *)&len,(void *)*local_170,local_a8);
  }
  MD5_Final((uchar *)&p,(MD5_CTX *)&len);
  cs_to_hex(buf,(uchar *)&p,0x10);
  return buf;
}

Assistant:

char *cs_md5(char buf[33], ...) {
    unsigned char hash[16];
    const unsigned char *p;
    va_list ap;
    MD5_CTX ctx;

    MD5_Init(&ctx);

    va_start(ap, buf);
    while ((p = va_arg(ap, const unsigned char *)) != NULL) {
        size_t len = va_arg(ap, size_t);
        MD5_Update(&ctx, p, len);
    }
    va_end(ap);

    MD5_Final(hash, &ctx);
    cs_to_hex(buf, hash, sizeof(hash));

    return buf;
}